

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O1

Vector2f __thiscall sf::Text::findCharacterPos(Text *this,size_t index)

{
  Uint32 second;
  size_t sVar1;
  Glyph *pGVar2;
  Transform *this_00;
  bool bold;
  Uint32 first;
  float fVar3;
  Vector2f VVar4;
  Vector2f local_50;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  String *local_38;
  
  if (this->m_font == (Font *)0x0) {
    VVar4.x = 0.0;
    VVar4.y = 0.0;
  }
  else {
    local_38 = &this->m_string;
    sVar1 = String::getSize(local_38);
    if (sVar1 < index) {
      index = String::getSize(local_38);
    }
    bold = (bool)((byte)this->m_style & 1);
    pGVar2 = Font::getGlyph(this->m_font,0x20,this->m_characterSize,bold,0.0);
    local_44 = pGVar2->advance;
    local_48 = this->m_letterSpacingFactor;
    local_3c = Font::getLineSpacing(this->m_font,this->m_characterSize);
    local_3c = local_3c * this->m_lineSpacingFactor;
    local_50.x = 0.0;
    local_50.y = 0.0;
    if (index != 0) {
      local_48 = (local_48 + -1.0) * (local_44 / 3.0);
      local_44 = local_44 + local_48;
      sVar1 = 0;
      local_40 = local_44 * 4.0;
      first = 0;
      do {
        second = String::operator[](local_38,sVar1);
        fVar3 = Font::getKerning(this->m_font,first,second,this->m_characterSize,bold);
        fVar3 = fVar3 + local_50.x;
        if (second == 9) {
          local_50.x = fVar3 + local_40;
LAB_0017b1b2:
        }
        else {
          if (second != 10) {
            if (second == 0x20) {
              local_50.x = fVar3 + local_44;
            }
            else {
              local_50.x = fVar3;
              pGVar2 = Font::getGlyph(this->m_font,second,this->m_characterSize,bold,0.0);
              local_50.x = pGVar2->advance + local_48 + local_50.x;
            }
            goto LAB_0017b1b2;
          }
          local_50 = (Vector2f)((ulong)(uint)(local_50.y + local_3c) << 0x20);
        }
        sVar1 = sVar1 + 1;
        first = second;
      } while (index != sVar1);
    }
    this_00 = Transformable::getTransform(&this->super_Transformable);
    VVar4 = Transform::transformPoint(this_00,&local_50);
  }
  return VVar4;
}

Assistant:

Vector2f Text::findCharacterPos(std::size_t index) const
{
    // Make sure that we have a valid font
    if (!m_font)
        return Vector2f();

    // Adjust the index if it's out of range
    if (index > m_string.getSize())
        index = m_string.getSize();

    // Precompute the variables needed by the algorithm
    bool  isBold          = m_style & Bold;
    float whitespaceWidth = m_font->getGlyph(L' ', m_characterSize, isBold).advance;
    float letterSpacing   = ( whitespaceWidth / 3.f ) * ( m_letterSpacingFactor - 1.f );
    whitespaceWidth      += letterSpacing;
    float lineSpacing     = m_font->getLineSpacing(m_characterSize) * m_lineSpacingFactor;

    // Compute the position
    Vector2f position;
    Uint32 prevChar = 0;
    for (std::size_t i = 0; i < index; ++i)
    {
        Uint32 curChar = m_string[i];

        // Apply the kerning offset
        position.x += m_font->getKerning(prevChar, curChar, m_characterSize, isBold);
        prevChar = curChar;

        // Handle special characters
        switch (curChar)
        {
            case ' ':  position.x += whitespaceWidth;             continue;
            case '\t': position.x += whitespaceWidth * 4;         continue;
            case '\n': position.y += lineSpacing; position.x = 0; continue;
        }

        // For regular characters, add the advance offset of the glyph
        position.x += m_font->getGlyph(curChar, m_characterSize, isBold).advance + letterSpacing;
    }

    // Transform the position to global coordinates
    position = getTransform().transformPoint(position);

    return position;
}